

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# triangular.hpp
# Opt level: O2

functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_> * __thiscall
ising::free_energy::triangular::(anonymous_namespace)::
func<double,boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>>
          (functor<double,_boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>_>
           *__return_storage_ptr__,_anonymous_namespace_ *this,double Ja,double Jb,double Jc,
          fvar<double,_2UL> beta)

{
  fvar<double,_2UL> *cr;
  fvar<double,_2UL> *cr_00;
  fvar<double,_2UL> *cr_01;
  fvar<double,_2UL> *cr_02;
  fvar<double,_2UL> *cr_03;
  fvar<double,_2UL> *cr_04;
  fvar<double,_2UL> retval_2;
  fvar<double,_2UL> retval;
  fvar<double,_2UL> retval_1;
  fvar<double,_2UL> retval_10;
  fvar<double,_2UL> retval_11;
  fvar<double,_2UL> retval_8;
  fvar<double,_2UL> retval_9;
  fvar<double,_2UL> retval_6;
  fvar<double,_2UL> retval_7;
  double local_208;
  double local_200;
  fvar<double,_2UL> *local_1f8;
  fvar<double,_2UL> *local_1f0;
  fvar<double,2ul> *local_1e8;
  double local_1e0;
  fvar<double,_2UL> local_1d8;
  fvar<double,_2UL> local_1b8;
  fvar<double,_2UL> local_198;
  root_type local_178;
  root_type local_170;
  root_type local_168;
  root_type local_160 [3];
  fvar<double,_2UL> local_148;
  double local_128;
  double dStack_120;
  double local_118;
  fvar<double,_2UL> local_108;
  double local_e8;
  double dStack_e0;
  double local_d8;
  fvar<double,_2UL> local_c8;
  double local_a8;
  double dStack_a0;
  double local_98;
  fvar<double,2ul> local_90 [24];
  promote<fvar<double,_2UL>,_fvar<double,_2UL>_> local_78;
  fvar<double,_2UL> local_60;
  fvar<double,_2UL> local_48;
  
  __return_storage_ptr__->c_ = 0.012665147955292222;
  local_1d8.v._M_elems[0] = 2.0;
  local_1b8.v._M_elems[0] = beta.v._M_elems[0];
  local_1b8.v._M_elems[1] = beta.v._M_elems[1];
  local_1b8.v._M_elems[2] = beta.v._M_elems[2];
  local_208 = Jc;
  local_200 = Jb;
  local_1e0 = Ja;
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_1b8,(root_type *)&local_1d8);
  local_198.v._M_elems[0] = local_1b8.v._M_elems[0];
  local_198.v._M_elems[1] = local_1b8.v._M_elems[1];
  local_198.v._M_elems[2] = local_1b8.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_198,&local_1e0);
  local_1e8 = (fvar<double,2ul> *)&__return_storage_ptr__->sh2a_;
  boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
            ((fvar<double,_2UL> *)local_1e8,(detail *)&local_198,cr);
  local_160[0] = 2.0;
  local_1d8.v._M_elems[0] = beta.v._M_elems[0];
  local_1d8.v._M_elems[1] = beta.v._M_elems[1];
  local_1d8.v._M_elems[2] = beta.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_1d8,local_160);
  local_1b8.v._M_elems[0] = local_1d8.v._M_elems[0];
  local_1b8.v._M_elems[1] = local_1d8.v._M_elems[1];
  local_1b8.v._M_elems[2] = local_1d8.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_1b8,&local_200);
  boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
            (&local_198,(detail *)&local_1b8,cr_00);
  local_1f0 = &__return_storage_ptr__->sh2b_;
  (__return_storage_ptr__->sh2b_).v._M_elems[2] = local_198.v._M_elems[2];
  (__return_storage_ptr__->sh2b_).v._M_elems[0] = local_198.v._M_elems[0];
  (__return_storage_ptr__->sh2b_).v._M_elems[1] = local_198.v._M_elems[1];
  local_160[0] = 2.0;
  local_1d8.v._M_elems[0] = beta.v._M_elems[0];
  local_1d8.v._M_elems[1] = beta.v._M_elems[1];
  local_1d8.v._M_elems[2] = beta.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_1d8,local_160);
  local_1b8.v._M_elems[0] = local_1d8.v._M_elems[0];
  local_1b8.v._M_elems[1] = local_1d8.v._M_elems[1];
  local_1b8.v._M_elems[2] = local_1d8.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_1b8,&local_208);
  boost::math::differentiation::autodiff_v1::detail::sinh<double,2ul>
            (&local_198,(detail *)&local_1b8,cr_01);
  local_1f8 = &__return_storage_ptr__->sh2c_;
  (__return_storage_ptr__->sh2c_).v._M_elems[2] = local_198.v._M_elems[2];
  (__return_storage_ptr__->sh2c_).v._M_elems[0] = local_198.v._M_elems[0];
  (__return_storage_ptr__->sh2c_).v._M_elems[1] = local_198.v._M_elems[1];
  local_168 = 2.0;
  local_c8.v._M_elems[0] = beta.v._M_elems[0];
  local_c8.v._M_elems[1] = beta.v._M_elems[1];
  local_c8.v._M_elems[2] = beta.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_c8,&local_168);
  local_a8 = local_c8.v._M_elems[0];
  dStack_a0 = local_c8.v._M_elems[1];
  local_98 = local_c8.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            ((fvar<double,_2UL> *)&local_a8,&local_1e0);
  boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
            ((fvar<double,_2UL> *)local_160,(detail *)&local_a8,cr_02);
  local_170 = 2.0;
  local_108.v._M_elems[0] = beta.v._M_elems[0];
  local_108.v._M_elems[1] = beta.v._M_elems[1];
  local_108.v._M_elems[2] = beta.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_108,&local_170);
  local_e8 = local_108.v._M_elems[0];
  dStack_e0 = local_108.v._M_elems[1];
  local_d8 = local_108.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            ((fvar<double,_2UL> *)&local_e8,&local_200);
  boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
            (&local_48,(detail *)&local_e8,cr_03);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
            ((promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)&local_1d8,
             (fvar<double,2ul> *)local_160,&local_48);
  local_178 = 2.0;
  local_148.v._M_elems[0] = beta.v._M_elems[0];
  local_148.v._M_elems[1] = beta.v._M_elems[1];
  local_148.v._M_elems[2] = beta.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            (&local_148,&local_178);
  local_128 = local_148.v._M_elems[0];
  dStack_120 = local_148.v._M_elems[1];
  local_118 = local_148.v._M_elems[2];
  boost::math::differentiation::autodiff_v1::detail::fvar<double,_2UL>::operator*=
            ((fvar<double,_2UL> *)&local_128,&local_208);
  boost::math::differentiation::autodiff_v1::detail::cosh<double,2ul>
            (&local_60,(detail *)&local_128,cr_04);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
            (&local_1b8,(fvar<double,2ul> *)&local_1d8,&local_60);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
            ((promote<fvar<double,_2UL>,_fvar<double,_2UL>_> *)local_90,local_1e8,local_1f0);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator*
            (&local_78,local_90,local_1f8);
  boost::math::differentiation::autodiff_v1::detail::fvar<double,2ul>::operator+
            (&local_1b8,&local_78);
  (__return_storage_ptr__->cshabc_).v._M_elems[2] = local_198.v._M_elems[2];
  (__return_storage_ptr__->cshabc_).v._M_elems[0] = local_198.v._M_elems[0];
  (__return_storage_ptr__->cshabc_).v._M_elems[1] = local_198.v._M_elems[1];
  return __return_storage_ptr__;
}

Assistant:

functor<T, FVAR> func(T Ja, T Jb, T Jc, FVAR beta) {
  return functor<T, FVAR>(Ja, Jb, Jc, beta);
}